

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.h
# Opt level: O0

void __thiscall TGAColor::TGAColor(TGAColor *this,uchar *p,uchar bpp)

{
  uint local_24;
  int local_20;
  int i_1;
  int i;
  uchar bpp_local;
  uchar *p_local;
  TGAColor *this_local;
  
  memset(this,0,4);
  this->bytespp = bpp;
  for (local_20 = 0; local_20 < (int)(uint)bpp; local_20 = local_20 + 1) {
    this->bgra[local_20] = p[local_20];
  }
  for (local_24 = (uint)bpp; (int)local_24 < 4; local_24 = local_24 + 1) {
    this->bgra[(int)local_24] = '\0';
  }
  return;
}

Assistant:

TGAColor(const unsigned char *p, unsigned char bpp) : bgra(), bytespp(bpp) {
        for (int i=0; i<(int)bpp; i++) {
            bgra[i] = p[i];
        }
        for (int i=bpp; i<4; i++) {
            bgra[i] = 0;
        }
    }